

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O0

bool __thiscall libtorrent::dht::routing_table::is_full(routing_table *this,int bucket)

{
  int iVar1;
  size_type sVar2;
  pointer prVar3;
  bool local_31;
  __normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
  local_28;
  const_iterator i;
  int num_buckets;
  int bucket_local;
  routing_table *this_local;
  
  i._M_current._4_4_ = bucket;
  sVar2 = ::std::
          vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
          ::size(&(this->m_buckets).
                  super_vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
                );
  i._M_current._0_4_ = (int)sVar2;
  if ((int)i._M_current == 0) {
    this_local._7_1_ = false;
  }
  else if (i._M_current._4_4_ < (int)i._M_current) {
    local_28._M_current =
         (routing_table_node *)
         ::std::
         vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
         ::cbegin(&(this->m_buckets).
                   super_vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
                 );
    ::std::
    advance<__gnu_cxx::__normal_iterator<libtorrent::dht::routing_table_node_const*,std::vector<libtorrent::dht::routing_table_node,std::allocator<libtorrent::dht::routing_table_node>>>,int>
              (&local_28,i._M_current._4_4_);
    prVar3 = __gnu_cxx::
             __normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
             ::operator->(&local_28);
    sVar2 = ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ::size(&(prVar3->live_nodes).
                    super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  );
    iVar1 = bucket_limit(this,i._M_current._4_4_);
    local_31 = false;
    if (iVar1 <= (int)sVar2) {
      prVar3 = __gnu_cxx::
               __normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
               ::operator->(&local_28);
      sVar2 = ::std::
              vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
              size((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                    *)prVar3);
      local_31 = this->m_bucket_size <= (int)sVar2;
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool routing_table::is_full(int const bucket) const
{
	int const num_buckets = int(m_buckets.size());
	if (num_buckets == 0) return false;
	if (bucket >= num_buckets) return false;

	auto i = m_buckets.cbegin();
	std::advance(i, bucket);
	return (int(i->live_nodes.size()) >= bucket_limit(bucket)
		&& int(i->replacements.size()) >= m_bucket_size);
}